

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<void_*>::~Array(Array<void_*> *this)

{
  void **ppvVar1;
  size_t sVar2;
  
  ppvVar1 = this->ptr;
  if (ppvVar1 != (void **)0x0) {
    sVar2 = this->size_;
    this->ptr = (void **)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,ppvVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }